

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawList::_OnChangedVtxOffset(ImDrawList *this)

{
  ImVec4 IVar1;
  uint uVar2;
  uint uVar3;
  ImTextureID pvVar4;
  ImDrawCmd *__src;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  ImDrawCmd *pIVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  undefined1 in_ZMM1 [64];
  
  this->_VtxCurrentIdx = 0;
  pIVar8 = (this->CmdBuffer).Data;
  lVar10 = (long)(this->CmdBuffer).Size;
  if (pIVar8[lVar10 + -1].ElemCount != 0) {
    IVar1 = (this->_CmdHeader).ClipRect;
    auVar6 = vunpckhpd_avx((undefined1  [16])IVar1,ZEXT816(0) << 0x40);
    auVar6 = vcmpps_avx((undefined1  [16])IVar1,auVar6,2);
    auVar5 = vshufps_avx(auVar6,auVar6,0x50);
    auVar6 = vpcmpeqd_avx(in_ZMM1._0_16_,in_ZMM1._0_16_);
    if (((auVar6 & ~auVar5) >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
        -1 < SUB161(auVar6 & ~auVar5,0xf)) {
      pvVar4 = (this->_CmdHeader).TextureId;
      uVar2 = (this->_CmdHeader).VtxOffset;
      uVar3 = (this->IdxBuffer).Size;
      iVar7 = (this->CmdBuffer).Size;
      if (iVar7 == (this->CmdBuffer).Capacity) {
        if (iVar7 == 0) {
          iVar9 = 8;
        }
        else {
          iVar9 = iVar7 / 2 + iVar7;
        }
        iVar11 = iVar7 + 1;
        if (iVar7 + 1 < iVar9) {
          iVar11 = iVar9;
        }
        pIVar8 = (ImDrawCmd *)ImGui::MemAlloc((long)iVar11 * 0x38);
        __src = (this->CmdBuffer).Data;
        if (__src != (ImDrawCmd *)0x0) {
          memcpy(pIVar8,__src,(long)(this->CmdBuffer).Size * 0x38);
          ImGui::MemFree((this->CmdBuffer).Data);
        }
        (this->CmdBuffer).Data = pIVar8;
        (this->CmdBuffer).Capacity = iVar11;
        iVar7 = (this->CmdBuffer).Size;
      }
      else {
        pIVar8 = (this->CmdBuffer).Data;
      }
      pIVar8[iVar7].ClipRect = IVar1;
      pIVar8[iVar7].TextureId = pvVar4;
      pIVar8[iVar7].VtxOffset = uVar2;
      pIVar8[iVar7].IdxOffset = uVar3;
      *(undefined8 *)&pIVar8[iVar7].ElemCount = 0;
      *(ImDrawCallback *)(&pIVar8[iVar7].ElemCount + 2) = (ImDrawCallback)0x0;
      pIVar8[iVar7].UserCallbackData = (void *)0x0;
      (this->CmdBuffer).Size = (this->CmdBuffer).Size + 1;
      return;
    }
    __assert_fail("draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                  ,0x1c1,"void ImDrawList::AddDrawCmd()");
  }
  if (pIVar8[lVar10 + -1].UserCallback == (ImDrawCallback)0x0) {
    pIVar8[lVar10 + -1].VtxOffset = (this->_CmdHeader).VtxOffset;
    return;
  }
  __assert_fail("curr_cmd->UserCallback == __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                ,0x21d,"void ImDrawList::_OnChangedVtxOffset()");
}

Assistant:

void ImDrawList::_OnChangedVtxOffset()
{
    // We don't need to compare curr_cmd->VtxOffset != _CmdHeader.VtxOffset because we know it'll be different at the time we call this.
    _VtxCurrentIdx = 0;
    ImDrawCmd* curr_cmd = &CmdBuffer.Data[CmdBuffer.Size - 1];
    //IM_ASSERT(curr_cmd->VtxOffset != _CmdHeader.VtxOffset); // See #3349
    if (curr_cmd->ElemCount != 0)
    {
        AddDrawCmd();
        return;
    }
    IM_ASSERT(curr_cmd->UserCallback == NULL);
    curr_cmd->VtxOffset = _CmdHeader.VtxOffset;
}